

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* phosg::split_context
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *s,char delim,size_t max_splits)

{
  char cVar1;
  runtime_error *this;
  ulong uVar2;
  bool bVar3;
  size_type local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<char,_std::allocator<char>_> paren_stack;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paren_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  paren_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  paren_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar3 = false;
  uVar2 = 0;
  local_78 = 0;
  do {
    if (s->_M_string_length <= uVar2) {
      if (local_78 <= uVar2) {
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_68,s,local_78,0xffffffffffffffff);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_68);
        ::std::__cxx11::string::~string((string *)&local_68);
      }
      if (paren_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          paren_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error(this,"unbalanced parentheses in split_context");
        __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&paren_stack.super__Vector_base<char,_std::allocator<char>_>);
      return __return_storage_ptr__;
    }
    if (((bool)(paren_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start ==
                paren_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish | bVar3)) ||
       ((s->_M_dataplus)._M_p[uVar2] !=
        paren_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish[-1])) {
      if (paren_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start ==
          paren_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar3 = false;
      }
      else {
        cVar1 = paren_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish[-1];
        if (bVar3 || cVar1 != '\'' && cVar1 != '\"') {
          bVar3 = false;
        }
        else {
          bVar3 = (s->_M_dataplus)._M_p[uVar2] == '\\';
        }
        if ((cVar1 == '\"') || (cVar1 == '\'')) goto LAB_00108c20;
      }
      cVar1 = (s->_M_dataplus)._M_p[uVar2];
      if (cVar1 == '\"') {
        local_68._M_dataplus._M_p._0_1_ = 0x22;
        ::std::vector<char,_std::allocator<char>_>::emplace_back<char>
                  (&paren_stack,(char *)&local_68);
      }
      else if (cVar1 == '\'') {
        local_68._M_dataplus._M_p._0_1_ = 0x27;
        ::std::vector<char,_std::allocator<char>_>::emplace_back<char>
                  (&paren_stack,(char *)&local_68);
      }
      else if (cVar1 == '{') {
        local_68._M_dataplus._M_p._0_1_ = 0x7d;
        ::std::vector<char,_std::allocator<char>_>::emplace_back<char>
                  (&paren_stack,(char *)&local_68);
      }
      else if (cVar1 == '<') {
        local_68._M_dataplus._M_p._0_1_ = 0x3e;
        ::std::vector<char,_std::allocator<char>_>::emplace_back<char>
                  (&paren_stack,(char *)&local_68);
      }
      else if (cVar1 == '[') {
        local_68._M_dataplus._M_p._0_1_ = 0x5d;
        ::std::vector<char,_std::allocator<char>_>::emplace_back<char>
                  (&paren_stack,(char *)&local_68);
      }
      else if (cVar1 == '(') {
        local_68._M_dataplus._M_p._0_1_ = 0x29;
        ::std::vector<char,_std::allocator<char>_>::emplace_back<char>
                  (&paren_stack,(char *)&local_68);
      }
      else if ((cVar1 == delim &&
                paren_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start ==
                paren_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish) &&
              ((max_splits == 0 ||
               ((ulong)((long)(__return_storage_ptr__->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(__return_storage_ptr__->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5) < max_splits)))) {
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_68,s,local_78,uVar2 - local_78);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_68);
        ::std::__cxx11::string::~string((string *)&local_68);
        local_78 = uVar2 + 1;
      }
    }
    else {
      paren_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = paren_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      bVar3 = false;
    }
LAB_00108c20:
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

vector<string> split_context(const string& s, char delim, size_t max_splits) {
  vector<string> ret;
  vector<char> paren_stack;
  bool char_is_escaped = false;

  size_t z, last_start = 0;
  for (z = 0; z < s.size(); z++) {
    if (!char_is_escaped && !paren_stack.empty() && (s[z] == paren_stack.back())) {
      paren_stack.pop_back();
      continue;
    }
    bool in_quoted_string = (!paren_stack.empty() && ((paren_stack.back() == '\'') || (paren_stack.back() == '\"')));
    if (char_is_escaped) {
      char_is_escaped = false;
    } else if (in_quoted_string && s[z] == '\\') {
      char_is_escaped = true;
    }
    if (!in_quoted_string) {
      if (s[z] == '(') {
        paren_stack.push_back(')');
      } else if (s[z] == '[') {
        paren_stack.push_back(']');
      } else if (s[z] == '{') {
        paren_stack.push_back('}');
      } else if (s[z] == '<') {
        paren_stack.push_back('>');
      } else if (s[z] == '\'') {
        paren_stack.push_back('\'');
      } else if (s[z] == '\"') {
        paren_stack.push_back('\"');
      } else if (paren_stack.empty() && (s[z] == delim) && (!max_splits || (ret.size() < max_splits))) {
        ret.push_back(s.substr(last_start, z - last_start));
        last_start = z + 1;
      }
    }
  }

  if (z >= last_start) {
    ret.push_back(s.substr(last_start));
  }

  if (paren_stack.size()) {
    throw runtime_error("unbalanced parentheses in split_context");
  }

  return ret;
}